

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O2

void GetVert(Level *NewLev,Triangle *t,int c)

{
  byte *pbVar1;
  Vertex *pVVar2;
  int iVar3;
  int iVar4;
  TokenTypes TVar5;
  ulong uVar6;
  Vertex **ppVVar7;
  
  ExpectToken(TK_OPENBRACE);
  ExpectToken(TK_NUMBER);
  ppVVar7 = &NewLev->AllVerts;
  uVar6 = (ulong)(uint)c;
  iVar4 = Token.IQuantity + -1;
  do {
    iVar3 = iVar4;
    pVVar2 = *ppVVar7;
    t->Edges[uVar6] = pVVar2;
    if (pVVar2 == (Vertex *)0x0) {
      if (iVar3 != -2) {
        Error = 1;
        snprintf(ErrorText,0x400,"Unknown vertex referenced at line %d",(ulong)(uint)Lines);
        return;
      }
      break;
    }
    ppVVar7 = &pVVar2->Next;
    iVar4 = iVar3 + -1;
    Token.IQuantity = iVar3;
  } while (iVar3 + -1 != -2);
  ExpectToken(TK_COMMA);
  ExpectToken(TK_NUMBER);
  t->EdgeFlags[uVar6] = (screen_height * Token.IQuantity) / 0x1e0;
  GetToken();
  if (Token.Type != TK_CLOSEBRACE) {
    if (Token.Type == TK_COMMA) {
      TVar5 = TK_OPENBRACE;
      while (TVar5 == TK_OPENBRACE) {
        GetToken();
        TVar5 = Token.Type;
        if (Token.Type != TK_CLOSEBRACE) {
          if (Token.Type != TK_STRING) goto LAB_0010d0f6;
          iVar4 = bcmp(Token.Text,"edge",5);
          if (iVar4 == 0) {
            *(byte *)(t->EdgeFlags + uVar6) = (byte)t->EdgeFlags[uVar6] | 0x80;
          }
          iVar4 = bcmp(Token.Text,"collidable",0xb);
          if (iVar4 == 0) {
            pbVar1 = (byte *)((long)t->EdgeFlags + uVar6 * 4 + 1);
            *pbVar1 = *pbVar1 | 1;
          }
          iVar4 = bcmp(Token.Text,"foreground",0xb);
          TVar5 = TK_OPENBRACE;
          if (iVar4 == 0) {
            pbVar1 = (byte *)((long)t->EdgeFlags + uVar6 * 4 + 1);
            *pbVar1 = *pbVar1 | 2;
            TVar5 = TK_OPENBRACE;
          }
        }
      }
    }
    else {
LAB_0010d0f6:
      Error = 1;
    }
  }
  return;
}

Assistant:

static void GetVert(struct Level *NewLev, struct Triangle *t, int c)
{
   ExpectToken(TK_OPENBRACE);

   ExpectToken(TK_NUMBER);
   t->Edges[c] = NewLev->AllVerts;
   while (t->Edges[c] && Token.IQuantity--)
      t->Edges[c] = t->Edges[c]->Next;

   if (Token.IQuantity != -1) {
      Error = 1;
      snprintf(ErrorText, sizeof(ErrorText),
                "Unknown vertex referenced at line %d", Lines);
      return;
   }
   ExpectToken(TK_COMMA);

   ExpectToken(TK_NUMBER);
   t->EdgeFlags[c] = (Token.IQuantity * screen_height) / 480;

   GetToken();
   switch (Token.Type) {
      case TK_COMMA:
         {
            int Finished = false;

            while (!Finished) {
               GetToken();
               switch (Token.Type) {
                  case TK_CLOSEBRACE:
                     Finished = true;
                     break;
                  case TK_STRING:
                     if (!strcmp(Token.Text, "edge"))
                        t->EdgeFlags[c] |= TRIFLAGS_EDGE;
                     if (!strcmp(Token.Text, "collidable"))
                        t->EdgeFlags[c] |= FLAGS_COLLIDABLE;
                     if (!strcmp(Token.Text, "foreground"))
                        t->EdgeFlags[c] |= FLAGS_FOREGROUND;
                     break;
                  default:
                     Error = 1;
                     return;
               }
            }
         }
         break;
      case TK_CLOSEBRACE:
         break;
      default:
         Error = 1;
         return;
   }
}